

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O3

void __thiscall MeshLib::SolidDelegate::removeEdge(SolidDelegate *this,Solid *pS,Edge *e)

{
  int *piVar1;
  pointer pcVar2;
  tVertex inData;
  tVertex inData_00;
  Node<MeshLib::Vertex> *pNVar3;
  Node<MeshLib::Edge> *pNVar4;
  
  inData = Solid::idVertex(pS,(e->key).m_s);
  inData_00 = Solid::idVertex(pS,(e->key).m_t);
  if ((inData != (tVertex)0x0) && (inData->m_halfedge == (HalfEdge *)0x0)) {
    pNVar3 = AVL::Node<MeshLib::Vertex>::remove_node((pS->m_verts).root,inData);
    (pS->m_verts).root = pNVar3;
    if (pNVar3 != (Node<MeshLib::Vertex> *)0x0) {
      piVar1 = &(pS->m_verts).size;
      *piVar1 = *piVar1 + -1;
    }
    pcVar2 = (inData->m_string)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(inData->m_string).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(inData);
  }
  if ((inData_00 != (tVertex)0x0) && (inData_00->m_halfedge == (HalfEdge *)0x0)) {
    pNVar3 = AVL::Node<MeshLib::Vertex>::remove_node((pS->m_verts).root,inData_00);
    (pS->m_verts).root = pNVar3;
    if (pNVar3 != (Node<MeshLib::Vertex> *)0x0) {
      piVar1 = &(pS->m_verts).size;
      *piVar1 = *piVar1 + -1;
    }
    pcVar2 = (inData_00->m_string)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(inData_00->m_string).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(inData_00);
  }
  pNVar4 = AVL::Node<MeshLib::Edge>::remove_node((pS->m_edges).root,e);
  (pS->m_edges).root = pNVar4;
  if (pNVar4 != (Node<MeshLib::Edge> *)0x0) {
    piVar1 = &(pS->m_edges).size;
    *piVar1 = *piVar1 + -1;
  }
  return;
}

Assistant:

void SolidDelegate::removeEdge( Solid * pS, Edge * e)
{
	Vertex * v1 = pS->idVertex (e->ekey ().s ());
	Vertex * v2 = pS->idVertex (e->ekey ().t ());
	if(v1!= NULL && v1->halfedge () == NULL)
	{
		removeVertex(pS,v1);
		delete v1;
	}
	if(v2 != NULL && v2->halfedge () == NULL)
	{
		removeVertex(pS,v2);
		delete v2;
	}
	pS->m_edges.remove(e);
}